

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O0

Enum __thiscall
ViconDataStreamSDK::Core::VClient::GetCameraID
          (VClient *this,string *i_rCameraName,uint *o_rCameraID)

{
  Enum EVar1;
  VCameraInfo *pVVar2;
  VCameraInfo *pCamera;
  Enum GetResult;
  undefined1 local_30 [8];
  scoped_lock Lock;
  uint *o_rCameraID_local;
  string *i_rCameraName_local;
  VClient *this_local;
  
  Lock._8_8_ = o_rCameraID;
  boost::unique_lock<boost::recursive_mutex>::unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_30,&this->m_FrameMutex);
  ClientUtils::Clear((uint *)Lock._8_8_);
  pCamera._0_4_ = Success;
  pVVar2 = GetCamera(this,i_rCameraName,(Enum *)&pCamera);
  EVar1 = (Enum)pCamera;
  if (pVVar2 != (VCameraInfo *)0x0) {
    *(UInt32 *)Lock._8_8_ = pVVar2->m_CameraID;
  }
  boost::unique_lock<boost::recursive_mutex>::~unique_lock
            ((unique_lock<boost::recursive_mutex> *)local_30);
  return EVar1;
}

Assistant:

Result::Enum VClient::GetCameraID( const std::string & i_rCameraName, unsigned int & o_rCameraID ) const
{
  boost::recursive_mutex::scoped_lock Lock( m_FrameMutex );

  Clear( o_rCameraID );

  Result::Enum GetResult = Result::Success;
  const ViconCGStream::VCameraInfo * pCamera = GetCamera( i_rCameraName, GetResult );
  if ( pCamera )
  {
    o_rCameraID = pCamera->m_CameraID;
  }
  return GetResult;
}